

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DerTypes.h
# Opt level: O0

void __thiscall SequenceHelper::CheckExit(SequenceHelper *this)

{
  runtime_error *this_00;
  SequenceHelper *this_local;
  
  if (((this->isNull & 1U) == 0) && (*this->cbUsed != this->dataSize)) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Parsing error");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return;
}

Assistant:

void CheckExit() noexcept(false)
    {
        // if it isn't an error return, then make sure we've consumed all the data
        if (!isNull && cbUsed != dataSize)
            throw std::runtime_error("Parsing error");
    }